

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usetiter.cpp
# Opt level: O0

UBool __thiscall icu_63::UnicodeSetIterator::nextRange(UnicodeSetIterator *this)

{
  int index;
  UVector *this_00;
  UnicodeString *pUVar1;
  UnicodeSetIterator *this_local;
  
  this->string = (UnicodeString *)0x0;
  if (this->endElement < this->nextElement) {
    if (this->range < this->endRange) {
      this->range = this->range + 1;
      (*(this->super_UObject)._vptr_UObject[3])();
      this->codepointEnd = this->endElement;
      this->codepoint = this->nextElement;
      this->nextElement = this->endElement + 1;
      this_local._7_1_ = '\x01';
    }
    else if (this->nextString < this->stringCount) {
      this->codepoint = -1;
      this_00 = this->set->strings;
      index = this->nextString;
      this->nextString = index + 1;
      pUVar1 = (UnicodeString *)UVector::elementAt(this_00,index);
      this->string = pUVar1;
      this_local._7_1_ = '\x01';
    }
    else {
      this_local._7_1_ = '\0';
    }
  }
  else {
    this->codepointEnd = this->endElement;
    this->codepoint = this->nextElement;
    this->nextElement = this->endElement + 1;
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool UnicodeSetIterator::nextRange() {
    string = NULL;
    if (nextElement <= endElement) {
        codepointEnd = endElement;
        codepoint = nextElement;
        nextElement = endElement+1;
        return TRUE;
    }
    if (range < endRange) {
        loadRange(++range);
        codepointEnd = endElement;
        codepoint = nextElement;
        nextElement = endElement+1;
        return TRUE;
    }

    if (nextString >= stringCount) return FALSE;
    codepoint = (UChar32)IS_STRING; // signal that value is actually a string
    string = (const UnicodeString*) set->strings->elementAt(nextString++);
    return TRUE;
}